

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O3

void __thiscall
r_exec::IPGMContext::getMember
          (IPGMContext *this,void **object,uint64_t *view_oid,ObjectType *object_type,
          int16_t *member_index)

{
  Atom *pAVar1;
  string area;
  Code *pCVar2;
  ulong *puVar3;
  ObjectType *pOVar4;
  char cVar5;
  byte bVar6;
  uint16_t uVar7;
  uint16_t index;
  int16_t iVar8;
  uint uVar9;
  Group *pGVar10;
  ulong uVar11;
  undefined1 in_stack_fffffffffffffec8 [16];
  Atom *in_stack_fffffffffffffed8;
  ushort in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee2;
  Data in_stack_fffffffffffffee4;
  Code *local_118;
  View *pVStack_110;
  IPGMContext local_108;
  Code *local_d8;
  View *pVStack_d0;
  ulong local_c8;
  ulong *local_c0;
  ObjectType *local_b8;
  IPGMContext local_b0;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  IPGMContext local_60;
  
  cVar5 = r_code::Atom::getDescriptor();
  if (cVar5 == -0x7c) {
    pAVar1 = (this->super__Context).code;
    local_d8 = this->object;
    pVStack_d0 = this->view;
    local_108.super__Context.index = r_code::Atom::asIndex();
    local_108.super__Context.overlay = (this->super__Context).overlay;
    local_108.super__Context.data = (this->super__Context).data;
    local_108.super__Context._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    local_108.object = local_d8;
    local_108.view = pVStack_d0;
    local_108.super__Context.code = pAVar1;
    cVar5 = r_code::Atom::getDescriptor();
    if (cVar5 == -0x40) {
      getChild(&local_b0,&local_108,1);
      operator*((IPGMContext *)&stack0xfffffffffffffec8,&local_b0);
      local_d8 = (Code *)member_index;
      local_c0 = view_oid;
      local_b8 = object_type;
      uVar7 = getChildrenCount(&local_108);
      local_c8 = (ulong)uVar7;
      if (2 < uVar7) {
        uVar11 = 8;
        do {
          cVar5 = r_code::Atom::getDescriptor();
          if (cVar5 == -0x6f) {
            in_stack_fffffffffffffed8 = (Atom *)&(pVStack_110->super_View).field_0x28;
            in_stack_fffffffffffffee0 = 0;
            in_stack_fffffffffffffee4 = VIEW;
          }
          else {
            index = r_code::Atom::asIndex();
            getChild(&local_60,(IPGMContext *)&stack0xfffffffffffffec8,index);
            operator*(&local_b0,&local_60);
            local_118 = local_b0.object;
            pVStack_110 = local_b0.view;
            in_stack_fffffffffffffed8 = local_b0.super__Context.code;
            in_stack_fffffffffffffee0 = local_b0.super__Context.index;
            in_stack_fffffffffffffee4 = local_b0.super__Context.data;
          }
          uVar11 = uVar11 + 4;
        } while ((uint)uVar7 * 4 != uVar11);
      }
      bVar6 = r_code::Atom::getDescriptor();
      pOVar4 = local_b8;
      puVar3 = local_c0;
      pCVar2 = local_d8;
      uVar9 = bVar6 - 0xc1;
      if (uVar9 < 0xe) {
        if ((0x3f0cU >> (uVar9 & 0x1f) & 1) == 0) {
          if ((0x83U >> (uVar9 & 0x1f) & 1) == 0) goto LAB_0015dae3;
          if (in_stack_fffffffffffffee4 == VALUE_ARRAY) {
            local_80[0] = local_70;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"IPGMContext","");
            area.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffed8;
            area._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8._0_8_;
            area._M_string_length = in_stack_fffffffffffffec8._8_8_;
            area.field_2._8_2_ = in_stack_fffffffffffffee0;
            area.field_2._10_2_ = in_stack_fffffffffffffee2;
            area.field_2._12_4_ = in_stack_fffffffffffffee4;
            debug(area);
            DebugStream::operator<<((DebugStream *)&local_b0,"This will never work, aborting");
            DebugStream::~DebugStream((DebugStream *)&local_b0);
            if (local_80[0] != local_70) {
              operator_delete(local_80[0]);
            }
            r_code::Atom::trace();
            exit(0);
          }
          pGVar10 = r_exec::View::get_host(pVStack_110);
          *object = pGVar10;
          *puVar3 = (ulong)*(uint *)(in_stack_fffffffffffffed8 +
                                    (ulong)in_stack_fffffffffffffee0 * 4 + 0x30);
          *pOVar4 = TYPE_VIEW;
        }
        else {
          *local_b8 = TYPE_OBJECT;
          *object = local_118;
        }
        iVar8 = r_code::Atom::asIndex();
        *(int16_t *)pCVar2 = iVar8;
        return;
      }
LAB_0015dae3:
      *object = (void *)0x0;
      *local_b8 = TYPE_UNDEFINED;
      return;
    }
  }
  *object = (void *)0x0;
  *object_type = TYPE_UNDEFINED;
  *member_index = 0;
  return;
}

Assistant:

void IPGMContext::getMember(void *&object, uint64_t &view_oid, ObjectType &object_type, int16_t &member_index) const
{
    if ((*this)[0].getDescriptor() != Atom::I_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext cptr = IPGMContext(this->object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data); // dereference manually (1 offset) to retain the cptr as is.

    if (cptr[0].getDescriptor() != Atom::C_PTR) { // ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        member_index = 0;
        return;
    }

    IPGMContext c = *cptr.getChild(1); // this, vl_ptr, value_ptr or rptr.
    uint16_t atom_count = cptr.getChildrenCount();

    for (uint16_t i = 2; i < atom_count; ++i) { // stop before the last iptr.
        if (cptr[i].getDescriptor() == Atom::VIEW) {
            c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
        } else {
            c = *c.getChild(cptr[i].asIndex());
        }
    }

    // at this point, c is an iptr dereferenced to an object or a view; the next iptr holds the member index.
    // c is pointing at the first atom of an object or a view.
    switch (c[0].getDescriptor()) {
    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
        object_type = TYPE_OBJECT;
        object = c.getObject();
        break;

    case Atom::GROUP:
    case Atom::SET: // dynamically generated views can be sets.
    case Atom::S_SET: // views are always copied; set the object to the view's group on which to perform an operation for the view's oid.
        if (c.data == VALUE_ARRAY) {
            // FIXME: I'm not sure how this could ever have worked
            debug("IPGMContext") << "This will never work, aborting";
            c[VIEW_CODE_MAX_SIZE].trace();
            exit(0);
            object = (Group *)c[VIEW_CODE_MAX_SIZE].atom; // first reference of grp in a view stored in athe value array.
        } else {
            object = c.view->get_host();
        }

        view_oid = c[VIEW_OID].atom; // oid is hidden at the end of the view code; stored directly as a uint64.
        object_type = TYPE_VIEW;
        break;

    default: // atomic value or ill-formed mod/set expression.
        object = nullptr;
        object_type = TYPE_UNDEFINED;
        return;
    }

    // get the index held by the last iptr.
    member_index = cptr[atom_count].asIndex();
}